

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cc
# Opt level: O2

void * raptor::Malloc(size_t size)

{
  void *pvVar1;
  
  if (size == 0) {
    pvVar1 = (void *)0x0;
  }
  else {
    pvVar1 = malloc(size);
    if (pvVar1 == (void *)0x0) {
      abort();
    }
  }
  return pvVar1;
}

Assistant:

void* Malloc(size_t size) {
    if (size > 0) {
        void* ptr = ::malloc(size);
        if (!ptr) {
            abort();
        }
        return ptr;
    }
    return nullptr;
}